

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>>>
::find_or_prepare_insert_non_soo<std::basic_string_view<char,std::char_traits<char>>>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>>>
          *this,basic_string_view<char,_std::char_traits<char>_> *key)

{
  char *pcVar1;
  size_t size;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ushort uVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  undefined8 uVar14;
  bool bVar15;
  char cVar16;
  ushort uVar17;
  MixingHashState MVar18;
  anon_union_8_1_a8a14541_for_iterator_2 aVar19;
  ctrl_t *pcVar20;
  ulong uVar21;
  uint uVar22;
  bool bVar23;
  uint64_t v;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  FindInfo FVar30;
  __m128i match;
  ulong local_b0;
  char local_98;
  char cStack_97;
  char cStack_96;
  char cStack_95;
  char cStack_94;
  char cStack_93;
  char cStack_92;
  char cStack_91;
  EqualElement<std::basic_string_view<char,_std::char_traits<char>_>_> local_68;
  pair<std::tuple<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_std::tuple<const_std::basic_string_view<char,_std::char_traits<char>_>_&>_>
  local_58;
  undefined1 local_48 [16];
  
  size = key->_M_len;
  MVar18 = hash_internal::MixingHashState::combine_contiguous
                     ((MixingHashState)&hash_internal::MixingHashState::kSeed,(uchar *)key->_M_str,
                      size);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = MVar18.state_ + size;
  uVar2 = *(ulong *)this;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x145,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar25 = SUB168(auVar27 * ZEXT816(0x9ddfea08eb382d69),8) ^
           SUB168(auVar27 * ZEXT816(0x9ddfea08eb382d69),0);
  uVar3 = *(ulong *)(this + 0x10);
  uVar21 = (uVar25 >> 7 ^ uVar3 >> 0xc) & uVar2;
  auVar27 = ZEXT216(CONCAT11((char)uVar25,(char)uVar25) & 0x7f7f);
  auVar27 = pshuflw(auVar27,auVar27,0);
  local_48._0_4_ = auVar27._0_4_;
  local_48._4_4_ = local_48._0_4_;
  local_48._8_4_ = local_48._0_4_;
  local_48._12_4_ = local_48._0_4_;
  pcVar20 = (__return_storage_ptr__->first).ctrl_;
  aVar19 = (__return_storage_ptr__->first).field_1;
  bVar23 = __return_storage_ptr__->second;
  local_b0 = 0;
  do {
    pcVar1 = (char *)(uVar3 + uVar21);
    local_98 = *pcVar1;
    cStack_97 = pcVar1[1];
    cStack_96 = pcVar1[2];
    cStack_95 = pcVar1[3];
    cStack_94 = pcVar1[4];
    cStack_93 = pcVar1[5];
    cStack_92 = pcVar1[6];
    cStack_91 = pcVar1[7];
    uVar14 = *(undefined8 *)pcVar1;
    cVar16 = pcVar1[8];
    cVar7 = pcVar1[9];
    cVar8 = pcVar1[10];
    cVar9 = pcVar1[0xb];
    cVar10 = pcVar1[0xc];
    cVar11 = pcVar1[0xd];
    cVar12 = pcVar1[0xe];
    cVar13 = pcVar1[0xf];
    auVar28[0] = -(local_48[0] == local_98);
    auVar28[1] = -(local_48[1] == cStack_97);
    auVar28[2] = -(local_48[2] == cStack_96);
    auVar28[3] = -(local_48[3] == cStack_95);
    auVar28[4] = -(local_48[4] == cStack_94);
    auVar28[5] = -(local_48[5] == cStack_93);
    auVar28[6] = -(local_48[6] == cStack_92);
    auVar28[7] = -(local_48[7] == cStack_91);
    auVar28[8] = -(local_48[8] == cVar16);
    auVar28[9] = -(local_48[9] == cVar7);
    auVar28[10] = -(local_48[10] == cVar8);
    auVar28[0xb] = -(local_48[0xb] == cVar9);
    auVar28[0xc] = -(local_48[0xc] == cVar10);
    auVar28[0xd] = -(local_48[0xd] == cVar11);
    auVar28[0xe] = -(local_48[0xe] == cVar12);
    auVar28[0xf] = -(local_48[0xf] == cVar13);
    uVar17 = (ushort)(SUB161(auVar28 >> 7,0) & 1) | (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe | (ushort)(auVar28[0xf] >> 7) << 0xf;
    uVar22 = (uint)uVar17;
    while (uVar17 != 0) {
      uVar5 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar24 = uVar5 + uVar21 & uVar2;
      lVar26 = uVar24 * 0x20;
      local_58.second.
      super__Tuple_impl<0UL,_const_std::basic_string_view<char,_std::char_traits<char>_>_&>.
      super__Head_base<0UL,_const_std::basic_string_view<char,_std::char_traits<char>_>_&,_false>.
      _M_head_impl = (_Tuple_impl<0UL,_const_std::basic_string_view<char,_std::char_traits<char>_>_&>
                      )(*(long *)(this + 0x18) + lVar26 + 0x10);
      local_58.first.
      super__Tuple_impl<0UL,_const_std::basic_string_view<char,_std::char_traits<char>_>_&>.
      super__Head_base<0UL,_const_std::basic_string_view<char,_std::char_traits<char>_>_&,_false>.
      _M_head_impl = (_Tuple_impl<0UL,_const_std::basic_string_view<char,_std::char_traits<char>_>_&>
                      )(*(long *)(this + 0x18) + lVar26);
      local_68.rhs = key;
      local_68.eq = (key_equal *)this;
      bVar15 = memory_internal::
               DecomposePairImpl<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>>>::EqualElement<std::basic_string_view<char,std::char_traits<char>>>,std::basic_string_view<char,std::char_traits<char>>const&,std::tuple<std::basic_string_view<char,std::char_traits<char>>const&>>
                         (&local_68,&local_58);
      if (bVar15) {
        (__return_storage_ptr__->first).field_1 = aVar19;
        __return_storage_ptr__->second = bVar23;
        (__return_storage_ptr__->first).ctrl_ = pcVar20;
        if (*(long *)(this + 0x10) != 0) {
          lVar4 = *(long *)(this + 0x18);
          (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*(long *)(this + 0x10) + uVar24);
          (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(lVar26 + lVar4);
          __return_storage_ptr__->second = false;
          return __return_storage_ptr__;
        }
        goto LAB_0017fcda;
      }
      uVar17 = (ushort)(uVar22 - 1) & (ushort)uVar22;
      uVar22 = CONCAT22((short)(uVar22 - 1 >> 0x10),uVar17);
      local_98 = (char)uVar14;
      cStack_97 = (char)((ulong)uVar14 >> 8);
      cStack_96 = (char)((ulong)uVar14 >> 0x10);
      cStack_95 = (char)((ulong)uVar14 >> 0x18);
      cStack_94 = (char)((ulong)uVar14 >> 0x20);
      cStack_93 = (char)((ulong)uVar14 >> 0x28);
      cStack_92 = (char)((ulong)uVar14 >> 0x30);
      cStack_91 = (char)((ulong)uVar14 >> 0x38);
    }
    auVar29[0] = -(local_98 == -0x80);
    auVar29[1] = -(cStack_97 == -0x80);
    auVar29[2] = -(cStack_96 == -0x80);
    auVar29[3] = -(cStack_95 == -0x80);
    auVar29[4] = -(cStack_94 == -0x80);
    auVar29[5] = -(cStack_93 == -0x80);
    auVar29[6] = -(cStack_92 == -0x80);
    auVar29[7] = -(cStack_91 == -0x80);
    auVar29[8] = -(cVar16 == -0x80);
    auVar29[9] = -(cVar7 == -0x80);
    auVar29[10] = -(cVar8 == -0x80);
    auVar29[0xb] = -(cVar9 == -0x80);
    auVar29[0xc] = -(cVar10 == -0x80);
    auVar29[0xd] = -(cVar11 == -0x80);
    auVar29[0xe] = -(cVar12 == -0x80);
    auVar29[0xf] = -(cVar13 == -0x80);
    uVar17 = (ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe | (ushort)(auVar29[0xf] >> 7) << 0xf;
    if (uVar17 == 0) {
      if (*(ulong *)this < local_b0 + 0x10) {
        (__return_storage_ptr__->first).field_1 = aVar19;
        __return_storage_ptr__->second = bVar23;
        (__return_storage_ptr__->first).ctrl_ = pcVar20;
        __assert_fail("seq.index() <= capacity() && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xef5,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, std::basic_string_view<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string_view<char>, std::basic_string_view<char>>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, std::basic_string_view<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string_view<char>, std::basic_string_view<char>>>, K = std::basic_string_view<char>]"
                     );
      }
      uVar21 = uVar21 + local_b0 + 0x10 & uVar2;
      local_b0 = local_b0 + 0x10;
    }
    else {
      cVar16 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                         (*(ulong *)this,uVar25,*(ctrl_t **)(this + 0x10));
      if (cVar16 == '\0') {
        uVar22 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
          }
        }
      }
      else {
        uVar6 = 0xf;
        if (uVar17 != 0) {
          for (; uVar17 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar22 = (ushort)((uVar6 ^ 0xfff0) + 0x11) - 1;
      }
      FVar30.offset = uVar22 + uVar21 & uVar2;
      FVar30.probe_length = local_b0;
      lVar26 = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                         ((CommonFields *)this,uVar25,FVar30,
                          (PolicyFunctions *)GetPolicyFunctions()::value);
      if (*(long *)(this + 0x10) == 0) {
        (__return_storage_ptr__->first).field_1 = aVar19;
        __return_storage_ptr__->second = bVar23;
        (__return_storage_ptr__->first).ctrl_ = pcVar20;
LAB_0017fcda:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9c4,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, std::basic_string_view<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string_view<char>, std::basic_string_view<char>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, std::basic_string_view<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string_view<char>, std::basic_string_view<char>>>]"
                     );
      }
      pcVar20 = (ctrl_t *)(*(long *)(this + 0x10) + lVar26);
      aVar19.slot_ = (slot_type *)(lVar26 * 0x20 + *(long *)(this + 0x18));
      bVar23 = true;
    }
    if (uVar17 != 0) {
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)aVar19;
      __return_storage_ptr__->second = bVar23;
      (__return_storage_ptr__->first).ctrl_ = pcVar20;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    assert(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      assert(seq.index() <= capacity() && "full table!");
    }
  }